

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskContainer.cpp
# Opt level: O3

NodeFS * __thiscall NodeFS::InsertNode(NodeFS *this,string *node_name)

{
  pointer *pppNVar1;
  pointer ppNVar2;
  size_t __n;
  iterator __position;
  int iVar3;
  NodeFS *pNVar4;
  pointer ppNVar5;
  NodeFS *new_node;
  NodeFS *local_38;
  
  ppNVar5 = (this->sub_node_).super__Vector_base<NodeFS_*,_std::allocator<NodeFS_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppNVar2 = (this->sub_node_).super__Vector_base<NodeFS_*,_std::allocator<NodeFS_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppNVar5 != ppNVar2) {
    __n = node_name->_M_string_length;
    do {
      pNVar4 = *ppNVar5;
      if ((pNVar4->name_)._M_string_length == __n) {
        if (__n == 0) {
          return pNVar4;
        }
        iVar3 = bcmp((pNVar4->name_)._M_dataplus._M_p,(node_name->_M_dataplus)._M_p,__n);
        if (iVar3 == 0) {
          return pNVar4;
        }
      }
      ppNVar5 = ppNVar5 + 1;
    } while (ppNVar5 != ppNVar2);
  }
  pNVar4 = (NodeFS *)operator_new(0x68);
  pNVar4->_vptr_NodeFS = (_func_int **)&PTR__NodeFS_001cd530;
  (pNVar4->name_)._M_dataplus._M_p = (pointer)&(pNVar4->name_).field_2;
  (pNVar4->name_)._M_string_length = 0;
  (pNVar4->name_).field_2._M_local_buf[0] = '\0';
  (pNVar4->sub_node_).super__Vector_base<NodeFS_*,_std::allocator<NodeFS_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pNVar4->sub_node_).super__Vector_base<NodeFS_*,_std::allocator<NodeFS_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pNVar4->sub_node_).super__Vector_base<NodeFS_*,_std::allocator<NodeFS_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pNVar4->offset_ = 0;
  pNVar4->buffer_ = (uchar *)0x0;
  pNVar4->type_ = -1;
  local_38 = pNVar4;
  std::__cxx11::string::_M_assign((string *)&pNVar4->name_);
  pNVar4->is_leaf_ = false;
  __position._M_current =
       (this->sub_node_).super__Vector_base<NodeFS_*,_std::allocator<NodeFS_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->sub_node_).super__Vector_base<NodeFS_*,_std::allocator<NodeFS_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<NodeFS*,std::allocator<NodeFS*>>::_M_realloc_insert<NodeFS*const&>
              ((vector<NodeFS*,std::allocator<NodeFS*>> *)&this->sub_node_,__position,&local_38);
  }
  else {
    *__position._M_current = pNVar4;
    pppNVar1 = &(this->sub_node_).super__Vector_base<NodeFS_*,_std::allocator<NodeFS_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppNVar1 = *pppNVar1 + 1;
    local_38 = pNVar4;
  }
  return local_38;
}

Assistant:

NodeFS* NodeFS::InsertNode(std::string node_name)
{
   // Look for node : Already exists ?
   for (std::vector<NodeFS*>::iterator it = sub_node_.begin(); it != sub_node_.end(); ++it)
   {
      if ((*it)->name_ == node_name)
         return *it;
   }
   // It does not exists
   NodeFS* new_node = new NodeFS;
   new_node->name_ = node_name;
   new_node->is_leaf_ = false;
   sub_node_.push_back(new_node);

   return new_node;
}